

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dymon.cpp
# Opt level: O2

int __thiscall Dymon::start(Dymon *this,void *arg)

{
  int iVar1;
  uint32_t count;
  
  iVar1 = (**this->_vptr_Dymon)();
  this->connected = SUB41(iVar1,0);
  if (SUB41(iVar1,0) == false) {
    iVar1 = -2;
  }
  else {
    iVar1 = (*this->_vptr_Dymon[1])(this,"\x1bA\x01",3,0);
    if (iVar1 < 1) {
      iVar1 = -3;
    }
    else {
      count = (*this->_vptr_Dymon[2])(this,this->status,0x20);
      if ((int)count < 1) {
        iVar1 = -4;
      }
      else {
        if (dymonDebug != 0) {
          log_status(1,this->status,count);
        }
        this->index = 0;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int Dymon::start(void * arg)
{
   static const uint8_t _setupRequest[] = {
      0x1B, 0x40,      //(@) Reset printer
      0x1B, 0x56,      //(V) Get printer model and firmware version
   };
   static const uint8_t _statusRequest[] = {
      0x1B, 0x41, 1    //(A) Get printer status
   };
   uint8_t buffer[12] = { 0 };
   int status;

   //create TCP socket and connect to LabelWriter
   connected = this->connect(arg);
   if (connected == false)
   {
      return -2;
   }

#if 0 //LW550 doesn't answer to that request. so receive blocks until timeout which slows down usage
   //do soft reset and request LabelWriter model number and firmware version
   status = this->send(_setupRequest, sizeof(_setupRequest));
   if (status <= 0)
   {
      return -3;
   }
   this->receive(buffer, sizeof(buffer) - 1); //The information is returned as a 10- character ASCII string in the following format:
                                                         //Bytes[0..6]: 7 digit model number (e.g. "1750111");
                                                         //byte[7]: ascii char 'v'
                                                         //Bytes[8..9]: the two digit firmware version (e.g. "0N")
                                                       //See https://www.dymo-label-printers.co.uk/news/list-of-dymo-model-numbers.html for list of model numbers
   if (memcmp(buffer, "175", 3) == 0) //some kind of Labelwriter 450
   {
      this->lw450flavor = true;
   }
#endif

   //request LabelWriter status (active)
   status = this->send(_statusRequest, sizeof(_statusRequest));
   if (status <= 0)
   {
      return -3;
   }
   status = this->receive(this->status, sizeof(this->status));
   if (status <= 0)
   {
      return -4;
   }
#if 1
   if (dymonDebug)
   {
      log_status(1, this->status, status); //active status
   }
#endif
   //success
   index = 0;
   return 0;
}